

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O2

void __thiscall CEAngle::SetAngle(CEAngle *this,double *angle,CEAngleType *angle_type)

{
  invalid_value *this_00;
  double dVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (*angle_type == RADIANS) {
    dVar1 = *angle;
  }
  else {
    if (*angle_type != DEGREES) {
      this_00 = (invalid_value *)__cxa_allocate_exception(0xa8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_38,"CEAngle::SetAngle(const double&, const CEAngleType&)",
                 &local_59);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_58,"[ERROR] Method cannot be called with the provided CEAngleType"
                 ,&local_5a);
      CEException::invalid_value::invalid_value(this_00,&local_38,&local_58);
      __cxa_throw(this_00,&CEException::invalid_value::typeinfo,
                  CEExceptionHandler::~CEExceptionHandler);
    }
    dVar1 = *angle * 0.017453292519943295;
  }
  this->angle_ = dVar1;
  return;
}

Assistant:

void CEAngle::SetAngle(const double&      angle,
                       const CEAngleType& angle_type)
{
    // Set from degree angle
    if (angle_type == CEAngleType::DEGREES) {
        angle_ = angle * DD2R;
    }
    // Set from radians angle
    else if (angle_type == CEAngleType::RADIANS) {
        angle_ = angle;
    }
    // Otherwise throw an exception
    else {
        throw CEException::invalid_value(
            "CEAngle::SetAngle(const double&, const CEAngleType&)",
            "[ERROR] Method cannot be called with the provided CEAngleType");
    }

    return;
}